

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.hpp
# Opt level: O2

Gen<rc::detail::Any> * __thiscall
rc::gen::map<unsigned_long,rc::detail::Any(*)(unsigned_long&&)>
          (Gen<rc::detail::Any> *__return_storage_ptr__,gen *this,Gen<unsigned_long> *gen,
          _func_Any_unsigned_long_ptr **mapper)

{
  Gen<unsigned_long> GStack_78;
  MapGen<unsigned_long,_rc::detail::Any_(*)(unsigned_long_&&)> local_50;
  
  Gen<unsigned_long>::Gen(&GStack_78,(Gen<unsigned_long> *)this);
  detail::MapGen<unsigned_long,rc::detail::Any(*)(unsigned_long&&)>::
  MapGen<rc::detail::Any(*)(unsigned_long&&)>
            ((MapGen<unsigned_long,rc::detail::Any(*)(unsigned_long&&)> *)&local_50,&GStack_78,
             (_func_Any_unsigned_long_ptr **)gen);
  Gen<rc::detail::Any>::
  Gen<rc::gen::detail::MapGen<unsigned_long,rc::detail::Any(*)(unsigned_long&&)>,void>
            (__return_storage_ptr__,&local_50);
  Gen<unsigned_long>::~Gen(&local_50.m_gen);
  Gen<unsigned_long>::~Gen(&GStack_78);
  return __return_storage_ptr__;
}

Assistant:

Gen<Decay<typename rc::compat::return_type<Mapper,T>::type>> map(Gen<T> gen,
                                                         Mapper &&mapper) {
  return detail::MapGen<T, Decay<Mapper>>(std::move(gen),
                                          std::forward<Mapper>(mapper));
}